

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyhanabi.cc
# Opt level: O2

void StateGetMoveHistory(pyhanabi_state_t *state,int index,pyhanabi_history_item_t *item)

{
  void *pvVar1;
  HanabiMove HVar2;
  HanabiMove *pHVar3;
  const_reference pvVar4;
  
  if (state == (pyhanabi_state_t *)0x0) {
    __assert_fail("state != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/pyhanabi.cc"
                  ,0x1eb,
                  "void StateGetMoveHistory(pyhanabi_state_t *, int, pyhanabi_history_item_t *)");
  }
  pvVar1 = state->state;
  if (pvVar1 != (void *)0x0) {
    if (item != (pyhanabi_history_item_t *)0x0) {
      pHVar3 = (HanabiMove *)operator_new(0x10);
      pvVar4 = std::
               vector<hanabi_learning_env::HanabiHistoryItem,_std::allocator<hanabi_learning_env::HanabiHistoryItem>_>
               ::at((vector<hanabi_learning_env::HanabiHistoryItem,_std::allocator<hanabi_learning_env::HanabiHistoryItem>_>
                     *)((long)pvVar1 + 0x58),(long)index);
      HVar2 = *(HanabiMove *)&pvVar4->player;
      *pHVar3 = pvVar4->move;
      pHVar3[1] = HVar2;
      item->item = pHVar3;
      return;
    }
    __assert_fail("item != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/pyhanabi.cc"
                  ,0x1ed,
                  "void StateGetMoveHistory(pyhanabi_state_t *, int, pyhanabi_history_item_t *)");
  }
  __assert_fail("state->state != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/pyhanabi.cc"
                ,0x1ec,
                "void StateGetMoveHistory(pyhanabi_state_t *, int, pyhanabi_history_item_t *)");
}

Assistant:

void StateGetMoveHistory(pyhanabi_state_t* state, int index,
                         pyhanabi_history_item_t* item) {
  REQUIRE(state != nullptr);
  REQUIRE(state->state != nullptr);
  REQUIRE(item != nullptr);
  item->item = new hanabi_learning_env::HanabiHistoryItem(
      reinterpret_cast<const hanabi_learning_env::HanabiState*>(state->state)
          ->MoveHistory()
          .at(index));
}